

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode init_wc_data(Curl_easy *data)

{
  FILEPROTO *pFVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar5;
  ftp_wc *ftpwc;
  CURLcode result;
  WildcardData *wildcard;
  char *path;
  FTP *ftp;
  char *last_slash;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  pcVar4 = pFVar1->path;
  pcVar3 = strrchr(pFVar1->path,0x2f);
  if (pcVar3 == (char *)0x0) {
    if (*pcVar4 == '\0') {
      (data->wildcard).state = CURLWC_CLEAN;
      CVar2 = ftp_parse_url_path(data);
      return CVar2;
    }
    pcVar3 = (*Curl_cstrdup)(pcVar4);
    (data->wildcard).pattern = pcVar3;
    if ((data->wildcard).pattern == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *pcVar4 = '\0';
  }
  else {
    pcVar3 = pcVar3 + 1;
    if (*pcVar3 == '\0') {
      (data->wildcard).state = CURLWC_CLEAN;
      CVar2 = ftp_parse_url_path(data);
      return CVar2;
    }
    pcVar4 = (*Curl_cstrdup)(pcVar3);
    (data->wildcard).pattern = pcVar4;
    if ((data->wildcard).pattern == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *pcVar3 = '\0';
  }
  parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
  if (parserp == (ftp_parselist_data **)0x0) {
    ftpwc._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pfVar5 = Curl_ftp_parselist_data_alloc();
    *parserp = pfVar5;
    if (*parserp == (ftp_parselist_data *)0x0) {
      ftpwc._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      (data->wildcard).protdata = parserp;
      (data->wildcard).dtor = wc_data_dtor;
      if ((data->set).ftp_filemethod == '\x02') {
        (data->set).ftp_filemethod = '\x01';
      }
      ftpwc._4_4_ = ftp_parse_url_path(data);
      if (ftpwc._4_4_ == CURLE_OK) {
        pcVar4 = (*Curl_cstrdup)(pFVar1->path);
        (data->wildcard).path = pcVar4;
        if ((data->wildcard).path != (char *)0x0) {
          parserp[1] = (ftp_parselist_data *)(data->set).fwrite_func;
          (data->set).fwrite_func = Curl_ftp_parselist;
          parserp[2] = (ftp_parselist_data *)(data->set).out;
          (data->set).out = data;
          Curl_infof(data,"Wildcard - Parsing started");
          return CURLE_OK;
        }
        ftpwc._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  if (parserp != (ftp_parselist_data **)0x0) {
    Curl_ftp_parselist_data_free(parserp);
    (*Curl_cfree)(parserp);
  }
  (*Curl_cfree)((data->wildcard).pattern);
  (data->wildcard).pattern = (char *)0x0;
  (data->wildcard).dtor = (wildcard_dtor)0x0;
  (data->wildcard).protdata = (void *)0x0;
  return ftpwc._4_4_;
}

Assistant:

static CURLcode init_wc_data(struct Curl_easy *data)
{
  char *last_slash;
  struct FTP *ftp = data->req.p.ftp;
  char *path = ftp->path;
  struct WildcardData *wildcard = &(data->wildcard);
  CURLcode result = CURLE_OK;
  struct ftp_wc *ftpwc = NULL;

  last_slash = strrchr(ftp->path, '/');
  if(last_slash) {
    last_slash++;
    if(last_slash[0] == '\0') {
      wildcard->state = CURLWC_CLEAN;
      result = ftp_parse_url_path(data);
      return result;
    }
    wildcard->pattern = strdup(last_slash);
    if(!wildcard->pattern)
      return CURLE_OUT_OF_MEMORY;
    last_slash[0] = '\0'; /* cut file from path */
  }
  else { /* there is only 'wildcard pattern' or nothing */
    if(path[0]) {
      wildcard->pattern = strdup(path);
      if(!wildcard->pattern)
        return CURLE_OUT_OF_MEMORY;
      path[0] = '\0';
    }
    else { /* only list */
      wildcard->state = CURLWC_CLEAN;
      result = ftp_parse_url_path(data);
      return result;
    }
  }

  /* program continues only if URL is not ending with slash, allocate needed
     resources for wildcard transfer */

  /* allocate ftp protocol specific wildcard data */
  ftpwc = calloc(1, sizeof(struct ftp_wc));
  if(!ftpwc) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  /* INITIALIZE parselist structure */
  ftpwc->parser = Curl_ftp_parselist_data_alloc();
  if(!ftpwc->parser) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  wildcard->protdata = ftpwc; /* put it to the WildcardData tmp pointer */
  wildcard->dtor = wc_data_dtor;

  /* wildcard does not support NOCWD option (assert it?) */
  if(data->set.ftp_filemethod == FTPFILE_NOCWD)
    data->set.ftp_filemethod = FTPFILE_MULTICWD;

  /* try to parse ftp url */
  result = ftp_parse_url_path(data);
  if(result) {
    goto fail;
  }

  wildcard->path = strdup(ftp->path);
  if(!wildcard->path) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  /* backup old write_function */
  ftpwc->backup.write_function = data->set.fwrite_func;
  /* parsing write function */
  data->set.fwrite_func = Curl_ftp_parselist;
  /* backup old file descriptor */
  ftpwc->backup.file_descriptor = data->set.out;
  /* let the writefunc callback know the transfer */
  data->set.out = data;

  infof(data, "Wildcard - Parsing started");
  return CURLE_OK;

  fail:
  if(ftpwc) {
    Curl_ftp_parselist_data_free(&ftpwc->parser);
    free(ftpwc);
  }
  Curl_safefree(wildcard->pattern);
  wildcard->dtor = ZERO_NULL;
  wildcard->protdata = NULL;
  return result;
}